

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O3

void Ssw_ManPrintStats(Ssw_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Ssw_Pars_t *pSVar4;
  Aig_Man_t *pAVar5;
  uint uVar6;
  undefined8 in_RAX;
  int level;
  Ssw_Man_t *pSVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pSVar4 = p->pPars;
  uVar8 = CONCAT44((int)((ulong)in_RAX >> 0x20),pSVar4->nMaxLevs);
  pSVar7 = p;
  Abc_Print((int)p,
            "Parameters: F = %d. AddF = %d. C-lim = %d. Constr = %d. MaxLev = %d. Mem = %0.2f MB.\n"
            ,(double)p->nFrames * (double)p->pAig->vObjs->nSize * 24.0 * 9.5367431640625e-07,
            (ulong)(uint)pSVar4->nFramesK,(ulong)(uint)pSVar4->nFramesAddSim,
            (ulong)(uint)pSVar4->nBTLimit,(ulong)(uint)p->pAig->nConstrs,uVar8);
  pAVar5 = p->pAig;
  Abc_Print((int)pSVar7,"AIG       : PI = %d. PO = %d. Latch = %d. Node = %d.  Ave SAT vars = %d.\n"
            ,(ulong)(uint)pAVar5->nTruePis,(ulong)(uint)pAVar5->nTruePos,(ulong)(uint)pAVar5->nRegs,
            (ulong)(uint)(pAVar5->nObjs[6] + pAVar5->nObjs[5]),uVar8 & 0xffffffff00000000);
  uVar1 = p->nSatCallsSat;
  uVar2 = p->nSatProof;
  uVar3 = p->nSatFailsReal;
  pSVar7 = p;
  uVar6 = Ssw_ManCountEquivs(p);
  level = (int)pSVar7;
  Abc_Print(level,"SAT calls : Proof = %d. Cex = %d. Fail = %d. Lits proved = %d.\n",(ulong)uVar2,
            (ulong)uVar1,(ulong)uVar3,(ulong)uVar6);
  Abc_Print(level,"SAT solver: Vars max = %d. Calls max = %d. Recycles = %d. Sim rounds = %d.\n",
            (ulong)(uint)p->nVarsMax,(ulong)(uint)p->nCallsMax,(ulong)(uint)p->nRecyclesTotal,
            (ulong)(uint)p->nSimRounds);
  uVar1 = p->nNodesBeg;
  if (uVar1 == 0) {
    dVar9 = 1.0;
  }
  else {
    dVar9 = (double)(int)uVar1;
  }
  uVar2 = p->nRegsBeg;
  uVar8 = (ulong)uVar2;
  dVar10 = (double)(int)(uVar2 - p->nRegsEnd) * 100.0;
  if (uVar2 == 0) {
    uVar8 = 0;
  }
  else {
    dVar10 = dVar10 / (double)(int)uVar2;
  }
  Abc_Print(level,
            "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
            ((double)(int)(uVar1 - p->nNodesEnd) * 100.0) / dVar9,dVar10,(ulong)uVar1,
            (ulong)(uint)p->nNodesEnd,uVar8);
  p->timeOther = p->timeTotal -
                 (p->timeSimSat + p->timeReduce + p->timeMarkCones + p->timeBmc + p->timeSat);
  Abc_Print(level,"%s =","BMC        ");
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar9 = ((double)p->timeBmc * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeBmc / 1000000.0,dVar9);
  Abc_Print(level,"%s =","Spec reduce");
  dVar11 = (double)p->timeReduce;
  dVar10 = dVar11 / 1000000.0;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar11 = (dVar11 * 100.0) / (double)p->timeTotal;
    dVar9 = dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10,dVar9,dVar11);
  Abc_Print(level,"%s =","Mark cones ");
  dVar11 = (double)p->timeMarkCones;
  dVar10 = dVar11 / 1000000.0;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar11 = (dVar11 * 100.0) / (double)p->timeTotal;
    dVar9 = dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10,dVar9,dVar11);
  Abc_Print(level,"%s =","Sim SAT    ");
  dVar11 = (double)p->timeSimSat;
  dVar10 = dVar11 / 1000000.0;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar11 = (dVar11 * 100.0) / (double)p->timeTotal;
    dVar9 = dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10,dVar9,dVar11);
  Abc_Print(level,"%s =","SAT solving");
  dVar11 = (double)p->timeSat;
  dVar10 = dVar11 / 1000000.0;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar11 = (dVar11 * 100.0) / (double)p->timeTotal;
    dVar9 = dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10,dVar9,dVar11);
  Abc_Print(level,"%s =","  unsat    ");
  dVar11 = (double)p->timeSatUnsat;
  dVar10 = dVar11 / 1000000.0;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar11 = (dVar11 * 100.0) / (double)p->timeTotal;
    dVar9 = dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10,dVar9,dVar11);
  Abc_Print(level,"%s =","  sat      ");
  dVar11 = (double)p->timeSatSat;
  dVar10 = dVar11 / 1000000.0;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar11 = (dVar11 * 100.0) / (double)p->timeTotal;
    dVar9 = dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10,dVar9,dVar11);
  Abc_Print(level,"%s =","  undecided");
  dVar11 = (double)p->timeSatUndec;
  dVar10 = dVar11 / 1000000.0;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar11 = (dVar11 * 100.0) / (double)p->timeTotal;
    dVar9 = dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10,dVar9,dVar11);
  Abc_Print(level,"%s =","Other      ");
  dVar11 = (double)p->timeOther;
  dVar10 = dVar11 / 1000000.0;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar11 = (dVar11 * 100.0) / (double)p->timeTotal;
    dVar9 = dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10,dVar9,dVar11);
  Abc_Print(level,"%s =","TOTAL      ");
  dVar10 = (double)p->timeTotal;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar9 = (dVar10 * 100.0) / dVar10;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10 / 1000000.0,dVar9);
  if (p->pAig->nConstrs != 0) {
    Abc_Print(level,"Statistics reflecting the use of constraints:\n");
    Abc_Print(level,"Total cones  = %6d.  Constraint cones = %6d. (%6.2f %%)\n",
              ((double)p->nConesConstr * 100.0) / (double)p->nConesTotal);
    Abc_Print(level,"Total equivs = %6d.  Removed equivs   = %6d. (%6.2f %%)\n",
              ((double)p->nEquivsConstr * 100.0) / (double)p->nEquivsTotal);
    uVar1 = p->nNodesBegC;
    if (uVar1 == 0) {
      dVar9 = 1.0;
    }
    else {
      dVar9 = (double)(int)uVar1;
    }
    uVar2 = p->nRegsBegC;
    uVar8 = (ulong)uVar2;
    dVar10 = (double)(int)(uVar2 - p->nRegsEndC) * 100.0;
    if (uVar2 == 0) {
      uVar8 = 0;
    }
    else {
      dVar10 = dVar10 / (double)(int)uVar2;
    }
    Abc_Print(level,
              "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
              ,((double)(int)(uVar1 - p->nNodesEndC) * 100.0) / dVar9,dVar10,(ulong)uVar1,
              (ulong)(uint)p->nNodesEndC,uVar8);
    return;
  }
  return;
}

Assistant:

void Ssw_ManPrintStats( Ssw_Man_t * p )
{
    double nMemory = 1.0*Aig_ManObjNumMax(p->pAig)*p->nFrames*(2*sizeof(int)+2*sizeof(void*))/(1<<20);

    Abc_Print( 1, "Parameters: F = %d. AddF = %d. C-lim = %d. Constr = %d. MaxLev = %d. Mem = %0.2f MB.\n",
        p->pPars->nFramesK, p->pPars->nFramesAddSim, p->pPars->nBTLimit, Saig_ManConstrNum(p->pAig), p->pPars->nMaxLevs, nMemory );
    Abc_Print( 1, "AIG       : PI = %d. PO = %d. Latch = %d. Node = %d.  Ave SAT vars = %d.\n",
        Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), Saig_ManRegNum(p->pAig), Aig_ManNodeNum(p->pAig),
        0/(p->pPars->nIters+1) );
    Abc_Print( 1, "SAT calls : Proof = %d. Cex = %d. Fail = %d. Lits proved = %d.\n",
        p->nSatProof, p->nSatCallsSat, p->nSatFailsReal, Ssw_ManCountEquivs(p) );
    Abc_Print( 1, "SAT solver: Vars max = %d. Calls max = %d. Recycles = %d. Sim rounds = %d.\n",
        p->nVarsMax, p->nCallsMax, p->nRecyclesTotal, p->nSimRounds );
    Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
        p->nNodesBeg, p->nNodesEnd, 100.0*(p->nNodesBeg-p->nNodesEnd)/(p->nNodesBeg?p->nNodesBeg:1),
        p->nRegsBeg, p->nRegsEnd, 100.0*(p->nRegsBeg-p->nRegsEnd)/(p->nRegsBeg?p->nRegsBeg:1) );

    p->timeOther = p->timeTotal-p->timeBmc-p->timeReduce-p->timeMarkCones-p->timeSimSat-p->timeSat;
    ABC_PRTP( "BMC        ", p->timeBmc,       p->timeTotal );
    ABC_PRTP( "Spec reduce", p->timeReduce,    p->timeTotal );
    ABC_PRTP( "Mark cones ", p->timeMarkCones, p->timeTotal );
    ABC_PRTP( "Sim SAT    ", p->timeSimSat,    p->timeTotal );
    ABC_PRTP( "SAT solving", p->timeSat,       p->timeTotal );
    ABC_PRTP( "  unsat    ", p->timeSatUnsat,  p->timeTotal );
    ABC_PRTP( "  sat      ", p->timeSatSat,    p->timeTotal );
    ABC_PRTP( "  undecided", p->timeSatUndec,  p->timeTotal );
    ABC_PRTP( "Other      ", p->timeOther,     p->timeTotal );
    ABC_PRTP( "TOTAL      ", p->timeTotal,     p->timeTotal );

    // report the reductions
    if ( p->pAig->nConstrs )
    {
        Abc_Print( 1, "Statistics reflecting the use of constraints:\n" );
        Abc_Print( 1, "Total cones  = %6d.  Constraint cones = %6d. (%6.2f %%)\n",
            p->nConesTotal, p->nConesConstr, 100.0*p->nConesConstr/p->nConesTotal );
        Abc_Print( 1, "Total equivs = %6d.  Removed equivs   = %6d. (%6.2f %%)\n",
            p->nEquivsTotal, p->nEquivsConstr, 100.0*p->nEquivsConstr/p->nEquivsTotal );
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
            p->nNodesBegC, p->nNodesEndC, 100.0*(p->nNodesBegC-p->nNodesEndC)/(p->nNodesBegC?p->nNodesBegC:1),
            p->nRegsBegC, p->nRegsEndC,   100.0*(p->nRegsBegC-p->nRegsEndC)/(p->nRegsBegC?p->nRegsBegC:1) );
    }
}